

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AInventory * __thiscall AActor::GiveInventoryType(AActor *this,PClassActor *type)

{
  bool bVar1;
  AInventory *local_28;
  AInventory *item;
  PClassActor *type_local;
  AActor *this_local;
  
  local_28 = (AInventory *)0x0;
  if (type != (PClassActor *)0x0) {
    local_28 = (AInventory *)Spawn(type);
    bVar1 = AInventory::CallTryPickup(local_28,this,(AActor **)0x0);
    if (!bVar1) {
      (*(local_28->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      return (AInventory *)0x0;
    }
  }
  return local_28;
}

Assistant:

AInventory *AActor::GiveInventoryType (PClassActor *type)
{
	AInventory *item = NULL;

	if (type != NULL)
	{
		item = static_cast<AInventory *>(Spawn (type));
		if (!item->CallTryPickup (this))
		{
			item->Destroy ();
			return NULL;
		}
	}
	return item;
}